

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall t_js_generator::~t_js_generator(t_js_generator *this)

{
  ~t_js_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_js_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    gen_node_ = false;
    gen_jquery_ = false;
    gen_ts_ = false;
    gen_es6_ = false;
    gen_episode_file_ = false;

    bool with_ns_ = false;

    for (iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("node") == 0) {
        gen_node_ = true;
      } else if( iter->first.compare("jquery") == 0) {
        gen_jquery_ = true;
      } else if( iter->first.compare("ts") == 0) {
        gen_ts_ = true;
      } else if( iter->first.compare("with_ns") == 0) {
        with_ns_ = true;
      } else if( iter->first.compare("es6") == 0) {
        gen_es6_ = true;
      } else if( iter->first.compare("imports") == 0) {
        parse_imports(program, iter->second);
      } else if (iter->first.compare("thrift_package_output_directory") == 0) {
        parse_thrift_package_output_directory(iter->second);
      } else {
        throw std::invalid_argument("unknown option js:" + iter->first);
      }
    }

    if (gen_es6_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:es6,jquery] options not compatible");
    }

    if (gen_node_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:node,jquery] options not compatible, try: [-gen js:node -gen "
            "js:jquery]");
    }

    if (!gen_node_ && with_ns_) {
      throw std::invalid_argument("invalid switch: [-gen js:with_ns] is only valid when using node.js");
    }

    // Depending on the processing flags, we will update these to be ES6 compatible
    js_const_type_ = "var ";
    js_let_type_ = "var ";
    js_var_type_ = "var ";
    if (gen_es6_) {
      js_const_type_ = "const ";
      js_let_type_ = "let ";
    }

    if (gen_node_) {
      out_dir_base_ = "gen-nodejs";
      no_ns_ = !with_ns_;
    } else {
      out_dir_base_ = "gen-js";
      no_ns_ = false;
    }

    escape_['\''] = "\\'";
  }